

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BotSharedData.cpp
# Opt level: O2

void __thiscall tiger::trains::ai::BotSharedData::clear(BotSharedData *this,World *world)

{
  map<const_tiger::trains::world::Train_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
  *this_00;
  pointer ppTVar1;
  int iVar2;
  int iVar3;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *pvVar4;
  size_type sVar5;
  vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_> *pvVar6;
  mapped_type *__x;
  Point *pPVar7;
  Player *this_01;
  IPost *pIVar8;
  undefined4 extraout_var;
  pointer ppTVar9;
  Train *train;
  Train *local_48;
  BotSharedData *local_40;
  World *local_38;
  
  local_38 = world;
  pvVar4 = trains::world::World::getTrainList(world);
  ppTVar1 = (pvVar4->
            super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->trainInPoints;
  local_40 = this;
  for (ppTVar9 = (pvVar4->
                 super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppTVar9 != ppTVar1;
      ppTVar9 = ppTVar9 + 1) {
    local_48 = *ppTVar9;
    sVar5 = std::
            map<const_tiger::trains::world::Train_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
            ::count(this_00,&local_48);
    if (sVar5 != 0) {
      pvVar6 = trains::world::Train::getEvents(local_48);
      if ((pvVar6->
          super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (pvVar6->
          super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        pvVar6 = trains::world::Train::getEvents(local_48);
        iVar2 = (*(pvVar6->
                  super__Vector_base<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_IEvent[3])();
        iVar3 = trains::world::World::getTickNum(local_38);
        if (iVar3 + -3 <= iVar2) {
          __x = std::
                map<const_tiger::trains::world::Train_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
                ::operator[](this_00,&local_48);
          std::
          _Rb_tree<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::_Identity<const_tiger::trains::world::Point_*>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<const_tiger::trains::world::Point_*>_>
          ::erase((_Rb_tree<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::_Identity<const_tiger::trains::world::Point_*>,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<const_tiger::trains::world::Point_*>_>
                   *)local_40,__x);
          std::
          _Rb_tree<const_tiger::trains::world::Train_*,_std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>,_std::_Select1st<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<std::pair<const_tiger::trains::world::Train_*const,_const_tiger::trains::world::Point_*>_>_>
          ::erase(&this_00->_M_t,&local_48);
        }
      }
    }
    pPVar7 = trains::world::Train::getPoint(local_48);
    this_01 = trains::world::Train::getPlayer(local_48);
    pIVar8 = trains::world::Player::getHome(this_01);
    iVar2 = (*pIVar8->_vptr_IPost[5])(pIVar8);
    if (pPVar7 == (Point *)CONCAT44(extraout_var,iVar2)) {
      HomeChecker::comeHome(&this->cheker,local_48);
    }
  }
  HomeChecker::blockHome(&this->cheker,&local_40->inPoints);
  return;
}

Assistant:

void BotSharedData::clear(world::World *world)
{
    for (auto train : world->getTrainList())
    {
        if (trainInPoints.count(train) != 0 && !train->getEvents().empty() &&
                train->getEvents().back()->getTick() >= world->getTickNum() - 3)
        {

            inPoints.erase(trainInPoints[train]);
            trainInPoints.erase(train);
        }

        if (train->getPoint() == train->getPlayer()->getHome()->getPoint())
            cheker.comeHome(train);

    }

    cheker.blockHome(inPoints);
}